

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliStoreHuffmanTree
               (uint8_t *depths,size_t num,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  ulong local_670;
  size_t code;
  ulong uStack_660;
  int num_codes;
  size_t i;
  uint32_t huffman_tree_histogram [18];
  uint16_t local_608 [4];
  uint16_t code_length_bitdepth_symbols [18];
  uint8_t local_5d8 [8];
  uint8_t code_length_bitdepth [18];
  size_t huffman_tree_size;
  uint8_t huffman_tree_extra_bits [704];
  uint8_t huffman_tree [704];
  uint8_t *storage_local;
  size_t *storage_ix_local;
  HuffmanTree *tree_local;
  size_t num_local;
  uint8_t *depths_local;
  
  stack0xfffffffffffffa40 = 0;
  memset(local_5d8,0,0x12);
  memset(&i,0,0x48);
  code._4_4_ = 0;
  local_670 = 0;
  if (0x2c0 < num) {
    __assert_fail("num <= BROTLI_NUM_COMMAND_SYMBOLS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                  ,0x13a,
                  "void BrotliStoreHuffmanTree(const uint8_t *, size_t, HuffmanTree *, size_t *, uint8_t *)"
                 );
  }
  BrotliWriteHuffmanTree
            (depths,num,(size_t *)(code_length_bitdepth + 0x10),huffman_tree_extra_bits + 0x2b8,
             (uint8_t *)&huffman_tree_size);
  for (uStack_660 = 0; uStack_660 < stack0xfffffffffffffa40; uStack_660 = uStack_660 + 1) {
    huffman_tree_histogram[(ulong)huffman_tree_extra_bits[uStack_660 + 0x2b8] - 2] =
         huffman_tree_histogram[(ulong)huffman_tree_extra_bits[uStack_660 + 0x2b8] - 2] + 1;
  }
  uStack_660 = 0;
  do {
    if (0x11 < uStack_660) {
LAB_001386d9:
      BrotliCreateHuffmanTree((uint32_t *)&i,0x12,5,tree,local_5d8);
      BrotliConvertBitDepthsToSymbols(local_5d8,0x12,local_608);
      BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(code._4_4_,local_5d8,storage_ix,storage);
      if (code._4_4_ == 1) {
        local_5d8[local_670] = '\0';
      }
      BrotliStoreHuffmanTreeToBitMask
                (stack0xfffffffffffffa40,huffman_tree_extra_bits + 0x2b8,
                 (uint8_t *)&huffman_tree_size,local_5d8,local_608,storage_ix,storage);
      return;
    }
    if (huffman_tree_histogram[uStack_660 - 2] != 0) {
      if (code._4_4_ == 0) {
        local_670 = uStack_660;
        code._4_4_ = 1;
      }
      else if (code._4_4_ == 1) {
        code._4_4_ = 2;
        goto LAB_001386d9;
      }
    }
    uStack_660 = uStack_660 + 1;
  } while( true );
}

Assistant:

void BrotliStoreHuffmanTree(const uint8_t* depths, size_t num,
                            HuffmanTree* tree,
                            size_t *storage_ix, uint8_t *storage) {
  /* Write the Huffman tree into the brotli-representation.
     The command alphabet is the largest, so this allocation will fit all
     alphabets. */
  uint8_t huffman_tree[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t huffman_tree_extra_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t huffman_tree_size = 0;
  uint8_t code_length_bitdepth[BROTLI_CODE_LENGTH_CODES] = { 0 };
  uint16_t code_length_bitdepth_symbols[BROTLI_CODE_LENGTH_CODES];
  uint32_t huffman_tree_histogram[BROTLI_CODE_LENGTH_CODES] = { 0 };
  size_t i;
  int num_codes = 0;
  size_t code = 0;

  assert(num <= BROTLI_NUM_COMMAND_SYMBOLS);

  BrotliWriteHuffmanTree(depths, num, &huffman_tree_size, huffman_tree,
                         huffman_tree_extra_bits);

  /* Calculate the statistics of the Huffman tree in brotli-representation. */
  for (i = 0; i < huffman_tree_size; ++i) {
    ++huffman_tree_histogram[huffman_tree[i]];
  }

  for (i = 0; i < BROTLI_CODE_LENGTH_CODES; ++i) {
    if (huffman_tree_histogram[i]) {
      if (num_codes == 0) {
        code = i;
        num_codes = 1;
      } else if (num_codes == 1) {
        num_codes = 2;
        break;
      }
    }
  }

  /* Calculate another Huffman tree to use for compressing both the
     earlier Huffman tree with. */
  BrotliCreateHuffmanTree(huffman_tree_histogram, BROTLI_CODE_LENGTH_CODES,
                          5, tree, code_length_bitdepth);
  BrotliConvertBitDepthsToSymbols(code_length_bitdepth,
                                  BROTLI_CODE_LENGTH_CODES,
                                  code_length_bitdepth_symbols);

  /* Now, we have all the data, let's start storing it */
  BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(num_codes, code_length_bitdepth,
                                               storage_ix, storage);

  if (num_codes == 1) {
    code_length_bitdepth[code] = 0;
  }

  /* Store the real Huffman tree now. */
  BrotliStoreHuffmanTreeToBitMask(huffman_tree_size,
                                  huffman_tree,
                                  huffman_tree_extra_bits,
                                  code_length_bitdepth,
                                  code_length_bitdepth_symbols,
                                  storage_ix, storage);
}